

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O1

void LoadExtByName(char *extensionName)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = 0;
  do {
    iVar1 = strcmp(extensionName,*(char **)((long)&ExtensionMap[0].extensionName + lVar2));
    if (iVar1 == 0) {
      lVar3 = (long)&ExtensionMap[0].extensionName + lVar2;
      break;
    }
    lVar2 = lVar2 + 0x18;
  } while ((int)lVar2 != 0x108);
  if (lVar3 != 0) {
    if (*(code **)(lVar3 + 0x10) == (code *)0x0) {
      iVar1 = 1;
    }
    else {
      iVar1 = (**(code **)(lVar3 + 0x10))();
      iVar1 = iVar1 + 1;
    }
    **(int **)(lVar3 + 8) = iVar1;
  }
  return;
}

Assistant:

static void LoadExtByName(const char *extensionName)
{
	ogl_StrToExtMap *entry = NULL;
	entry = FindExtEntry(extensionName);
	if(entry)
	{
		if(entry->LoadExtension)
		{
			int numFailed = entry->LoadExtension();
			if(numFailed == 0)
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
			}
			else
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED + numFailed;
			}
		}
		else
		{
			*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
		}
	}
}